

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::TagImport::TagImport(TagImport *this,string_view name)

{
  ImportMixin<(wabt::ExternalKind)4>::ImportMixin(&this->super_ImportMixin<(wabt::ExternalKind)4>);
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import =
       (_func_int **)&PTR__TagImport_00249e68;
  Tag::Tag(&this->tag,name);
  return;
}

Assistant:

explicit TagImport(std::string_view name = std::string_view())
      : ImportMixin<ExternalKind::Tag>(), tag(name) {}